

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall SHOPManagement::Person::changePhoneNumber(Person *this)

{
  ostream *poVar1;
  ulong uVar2;
  string local_60;
  undefined1 local_30 [8];
  string new_value;
  Person *this_local;
  
  new_value.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Phone Number(");
  getPhoneNumber_abi_cxx11_(&local_60,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,"): ");
  std::__cxx11::string::~string((string *)&local_60);
  std::istream::ignore();
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_30);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    setPhoneNumber(this,(string *)local_30);
    std::__cxx11::string::operator=
              ((string *)Helper::m_message_abi_cxx11_,"Phone number has been changed successfully.")
    ;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Person::changePhoneNumber()
    {
        std::string new_value;
        std::cout << "Phone Number(" << this->getPhoneNumber() << "): ";
        std::cin.ignore();
        std::getline(std::cin, new_value);

        if (!new_value.empty())
        {
            this->setPhoneNumber(new_value);
            Helper::m_message = "Phone number has been changed successfully.";
        }
    }